

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4.h
# Opt level: O3

bool __thiscall irr::core::CMatrix4<float>::getInverse(CMatrix4<float> *this,CMatrix4<float> *out)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  fVar1 = this->M[5];
  fVar15 = this->M[0];
  fVar16 = this->M[1];
  fVar2 = this->M[4];
  fVar3 = this->M[10];
  fVar4 = this->M[0xf];
  fVar5 = this->M[0xb];
  fVar6 = this->M[0xe];
  fVar17 = fVar3 * fVar4 - fVar6 * fVar5;
  fVar7 = this->M[6];
  fVar8 = this->M[2];
  fVar9 = this->M[9];
  fVar10 = this->M[0xd];
  fVar11 = this->M[3];
  fVar12 = this->M[7];
  fVar13 = this->M[8];
  fVar18 = fVar9 * fVar6 - fVar10 * fVar3;
  fVar14 = this->M[0xc];
  fVar16 = (fVar13 * fVar10 - fVar14 * fVar9) * (fVar8 * fVar12 - fVar11 * fVar7) +
           (((fVar13 * fVar4 - fVar5 * fVar14) * (fVar16 * fVar7 - fVar1 * fVar8) +
            (fVar15 * fVar12 - fVar2 * fVar11) * fVar18 +
            ((fVar15 * fVar1 - fVar2 * fVar16) * fVar17 -
            (fVar9 * fVar4 - fVar10 * fVar5) * (fVar15 * fVar7 - fVar2 * fVar8))) -
           (fVar6 * fVar13 - fVar3 * fVar14) * (fVar16 * fVar12 - fVar1 * fVar11));
  fVar15 = ABS(fVar16);
  if (1.1754944e-38 < fVar15) {
    fVar16 = 1.0 / fVar16;
    out->M[0] = (fVar12 * fVar18 + fVar1 * fVar17 + fVar7 * (fVar10 * fVar5 + fVar4 * -fVar9)) *
                fVar16;
    out->M[1] = ((this->M[1] * this->M[0xe] - this->M[0xd] * this->M[2]) * this->M[0xb] +
                (this->M[2] * this->M[0xf] - this->M[0xe] * this->M[3]) * this->M[9] +
                (this->M[3] * this->M[0xd] - this->M[0xf] * this->M[1]) * this->M[10]) * fVar16;
    out->M[2] = ((this->M[1] * this->M[6] - this->M[5] * this->M[2]) * this->M[0xf] +
                (this->M[2] * this->M[7] - this->M[6] * this->M[3]) * this->M[0xd] +
                (this->M[3] * this->M[5] - this->M[7] * this->M[1]) * this->M[0xe]) * fVar16;
    out->M[3] = ((this->M[6] * this->M[9] - this->M[10] * this->M[5]) * this->M[3] +
                (this->M[7] * this->M[10] - this->M[0xb] * this->M[6]) * this->M[1] +
                (this->M[0xb] * this->M[5] - this->M[7] * this->M[9]) * this->M[2]) * fVar16;
    out->M[4] = ((this->M[0xb] * this->M[0xe] - this->M[0xf] * this->M[10]) * this->M[4] +
                (this->M[8] * this->M[0xf] - this->M[0xc] * this->M[0xb]) * this->M[6] +
                (this->M[0xc] * this->M[10] - this->M[8] * this->M[0xe]) * this->M[7]) * fVar16;
    out->M[5] = ((this->M[3] * this->M[0xe] - this->M[0xf] * this->M[2]) * this->M[8] +
                (this->M[0] * this->M[0xf] - this->M[0xc] * this->M[3]) * this->M[10] +
                (this->M[0xc] * this->M[2] - this->M[0] * this->M[0xe]) * this->M[0xb]) * fVar16;
    out->M[6] = ((this->M[3] * this->M[6] - this->M[7] * this->M[2]) * this->M[0xc] +
                (this->M[0] * this->M[7] - this->M[4] * this->M[3]) * this->M[0xe] +
                (this->M[4] * this->M[2] - this->M[0] * this->M[6]) * this->M[0xf]) * fVar16;
    out->M[7] = ((this->M[6] * this->M[0xb] - this->M[10] * this->M[7]) * this->M[0] +
                (this->M[7] * this->M[8] - this->M[0xb] * this->M[4]) * this->M[2] +
                (this->M[4] * this->M[10] - this->M[8] * this->M[6]) * this->M[3]) * fVar16;
    out->M[8] = ((this->M[0xb] * this->M[0xc] - this->M[0xf] * this->M[8]) * this->M[5] +
                (this->M[8] * this->M[0xd] - this->M[0xc] * this->M[9]) * this->M[7] +
                (this->M[9] * this->M[0xf] - this->M[0xd] * this->M[0xb]) * this->M[4]) * fVar16;
    out->M[9] = ((this->M[3] * this->M[0xc] - this->M[0xf] * this->M[0]) * this->M[9] +
                (this->M[0] * this->M[0xd] - this->M[0xc] * this->M[1]) * this->M[0xb] +
                (this->M[1] * this->M[0xf] - this->M[0xd] * this->M[3]) * this->M[8]) * fVar16;
    out->M[10] = ((this->M[3] * this->M[4] - this->M[7] * this->M[0]) * this->M[0xd] +
                 (this->M[0] * this->M[5] - this->M[4] * this->M[1]) * this->M[0xf] +
                 (this->M[1] * this->M[7] - this->M[5] * this->M[3]) * this->M[0xc]) * fVar16;
    out->M[0xb] = ((this->M[4] * this->M[0xb] - this->M[8] * this->M[7]) * this->M[1] +
                  (this->M[5] * this->M[8] - this->M[9] * this->M[4]) * this->M[3] +
                  (this->M[9] * this->M[7] - this->M[5] * this->M[0xb]) * this->M[0]) * fVar16;
    out->M[0xc] = ((this->M[9] * this->M[0xc] - this->M[0xd] * this->M[8]) * this->M[6] +
                  (this->M[10] * this->M[0xd] - this->M[0xe] * this->M[9]) * this->M[4] +
                  (this->M[0xe] * this->M[8] - this->M[10] * this->M[0xc]) * this->M[5]) * fVar16;
    out->M[0xd] = ((this->M[1] * this->M[0xc] - this->M[0xd] * this->M[0]) * this->M[10] +
                  (this->M[2] * this->M[0xd] - this->M[0xe] * this->M[1]) * this->M[8] +
                  (this->M[0xe] * this->M[0] - this->M[2] * this->M[0xc]) * this->M[9]) * fVar16;
    out->M[0xe] = ((this->M[1] * this->M[4] - this->M[5] * this->M[0]) * this->M[0xe] +
                  (this->M[2] * this->M[5] - this->M[6] * this->M[1]) * this->M[0xc] +
                  (this->M[6] * this->M[0] - this->M[2] * this->M[4]) * this->M[0xd]) * fVar16;
    out->M[0xf] = ((this->M[4] * this->M[9] - this->M[8] * this->M[5]) * this->M[2] +
                  (this->M[5] * this->M[10] - this->M[9] * this->M[6]) * this->M[0] +
                  (this->M[6] * this->M[8] - this->M[10] * this->M[4]) * this->M[1]) * fVar16;
  }
  return 1.1754944e-38 < fVar15;
}

Assistant:

inline bool CMatrix4<T>::getInverse(CMatrix4<T> &out) const
{
	/// Calculates the inverse of this Matrix
	/// The inverse is calculated using Cramers rule.
	/// If no inverse exists then 'false' is returned.

#if defined(USE_MATRIX_TEST)
	if (this->isIdentity()) {
		out = *this;
		return true;
	}
#endif
	const CMatrix4<T> &m = *this;

	f32 d = (m[0] * m[5] - m[1] * m[4]) * (m[10] * m[15] - m[11] * m[14]) -
			(m[0] * m[6] - m[2] * m[4]) * (m[9] * m[15] - m[11] * m[13]) +
			(m[0] * m[7] - m[3] * m[4]) * (m[9] * m[14] - m[10] * m[13]) +
			(m[1] * m[6] - m[2] * m[5]) * (m[8] * m[15] - m[11] * m[12]) -
			(m[1] * m[7] - m[3] * m[5]) * (m[8] * m[14] - m[10] * m[12]) +
			(m[2] * m[7] - m[3] * m[6]) * (m[8] * m[13] - m[9] * m[12]);

	if (core::iszero(d, FLT_MIN))
		return false;

	d = core::reciprocal(d);

	out[0] = d * (m[5] * (m[10] * m[15] - m[11] * m[14]) +
						 m[6] * (m[11] * m[13] - m[9] * m[15]) +
						 m[7] * (m[9] * m[14] - m[10] * m[13]));
	out[1] = d * (m[9] * (m[2] * m[15] - m[3] * m[14]) +
						 m[10] * (m[3] * m[13] - m[1] * m[15]) +
						 m[11] * (m[1] * m[14] - m[2] * m[13]));
	out[2] = d * (m[13] * (m[2] * m[7] - m[3] * m[6]) +
						 m[14] * (m[3] * m[5] - m[1] * m[7]) +
						 m[15] * (m[1] * m[6] - m[2] * m[5]));
	out[3] = d * (m[1] * (m[7] * m[10] - m[6] * m[11]) +
						 m[2] * (m[5] * m[11] - m[7] * m[9]) +
						 m[3] * (m[6] * m[9] - m[5] * m[10]));
	out[4] = d * (m[6] * (m[8] * m[15] - m[11] * m[12]) +
						 m[7] * (m[10] * m[12] - m[8] * m[14]) +
						 m[4] * (m[11] * m[14] - m[10] * m[15]));
	out[5] = d * (m[10] * (m[0] * m[15] - m[3] * m[12]) +
						 m[11] * (m[2] * m[12] - m[0] * m[14]) +
						 m[8] * (m[3] * m[14] - m[2] * m[15]));
	out[6] = d * (m[14] * (m[0] * m[7] - m[3] * m[4]) +
						 m[15] * (m[2] * m[4] - m[0] * m[6]) +
						 m[12] * (m[3] * m[6] - m[2] * m[7]));
	out[7] = d * (m[2] * (m[7] * m[8] - m[4] * m[11]) +
						 m[3] * (m[4] * m[10] - m[6] * m[8]) +
						 m[0] * (m[6] * m[11] - m[7] * m[10]));
	out[8] = d * (m[7] * (m[8] * m[13] - m[9] * m[12]) +
						 m[4] * (m[9] * m[15] - m[11] * m[13]) +
						 m[5] * (m[11] * m[12] - m[8] * m[15]));
	out[9] = d * (m[11] * (m[0] * m[13] - m[1] * m[12]) +
						 m[8] * (m[1] * m[15] - m[3] * m[13]) +
						 m[9] * (m[3] * m[12] - m[0] * m[15]));
	out[10] = d * (m[15] * (m[0] * m[5] - m[1] * m[4]) +
						  m[12] * (m[1] * m[7] - m[3] * m[5]) +
						  m[13] * (m[3] * m[4] - m[0] * m[7]));
	out[11] = d * (m[3] * (m[5] * m[8] - m[4] * m[9]) +
						  m[0] * (m[7] * m[9] - m[5] * m[11]) +
						  m[1] * (m[4] * m[11] - m[7] * m[8]));
	out[12] = d * (m[4] * (m[10] * m[13] - m[9] * m[14]) +
						  m[5] * (m[8] * m[14] - m[10] * m[12]) +
						  m[6] * (m[9] * m[12] - m[8] * m[13]));
	out[13] = d * (m[8] * (m[2] * m[13] - m[1] * m[14]) +
						  m[9] * (m[0] * m[14] - m[2] * m[12]) +
						  m[10] * (m[1] * m[12] - m[0] * m[13]));
	out[14] = d * (m[12] * (m[2] * m[5] - m[1] * m[6]) +
						  m[13] * (m[0] * m[6] - m[2] * m[4]) +
						  m[14] * (m[1] * m[4] - m[0] * m[5]));
	out[15] = d * (m[0] * (m[5] * m[10] - m[6] * m[9]) +
						  m[1] * (m[6] * m[8] - m[4] * m[10]) +
						  m[2] * (m[4] * m[9] - m[5] * m[8]));

#if defined(USE_MATRIX_TEST)
	out.definitelyIdentityMatrix = definitelyIdentityMatrix;
#endif
	return true;
}